

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128crc.cpp
# Opt level: O2

void metrohash128crc_2(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  lVar8 = (ulong)seed * 0x2e4b2e1b + len;
  lVar12 = (ulong)seed * 0x797a90bb + len;
  uVar3 = lVar8 + 0xd4e05ca6945fff0b;
  uVar6 = lVar12 + 0x521b836fec4d4761;
  puVar5 = (uint *)key;
  if (0x1f < len) {
    uVar13 = lVar12 + 0x71290183ae35dc55;
    uVar9 = lVar8 + 0xe0b5ca3d59cada7f;
    do {
      uVar4 = crc32(uVar3,*(undefined8 *)puVar5);
      uVar7 = crc32(uVar6,*(undefined8 *)(puVar5 + 2));
      uVar14 = crc32(uVar13,*(undefined8 *)(puVar5 + 4));
      uVar10 = crc32(uVar9,*(undefined8 *)(puVar5 + 6));
      puVar5 = puVar5 + 8;
      uVar3 = uVar4 ^ uVar3;
      uVar6 = uVar7 ^ uVar6;
      uVar13 = uVar14 ^ uVar13;
      uVar9 = uVar10 ^ uVar9;
    } while (puVar5 <= key + (len - 0x20));
    uVar4 = (uVar9 + uVar3) * 0xee783e2f + uVar6;
    uVar13 = (uVar4 >> 0xc | uVar4 << 0x34) * 0xad07c493 ^ uVar13;
    uVar4 = (uVar13 + uVar6) * 0xad07c493 + uVar3;
    uVar9 = (uVar4 >> 0x13 | uVar4 << 0x2d) * 0xee783e2f ^ uVar9;
    uVar4 = (uVar13 + uVar3) * 0xee783e2f + uVar9;
    uVar13 = (uVar9 + uVar6) * 0xad07c493 + uVar13;
    uVar3 = uVar3 ^ (uVar4 >> 0xc | uVar4 << 0x34) * 0xad07c493;
    uVar6 = uVar6 ^ (uVar13 >> 0x13 | uVar13 << 0x2d) * 0xee783e2f;
  }
  puVar11 = key + (len - (long)puVar5);
  if (0xf < (long)puVar11) {
    lVar8 = *(long *)puVar5;
    puVar1 = puVar5 + 2;
    puVar5 = puVar5 + 4;
    uVar3 = lVar8 * 0x797a90bb + uVar3;
    uVar6 = *(long *)puVar1 * 0x797a90bb + uVar6;
    uVar3 = uVar3 >> 0x29 | uVar3 * 0x800000;
    uVar9 = uVar6 >> 0x29 | uVar6 * 0x800000;
    uVar6 = uVar9 * 0x2e4b2e1b;
    uVar13 = uVar3 * 0x15f7b2cad6b7ddb9 + uVar6;
    uVar3 = (uVar13 >> 10 | uVar13 << 0x36) * 0xad07c493 ^ uVar3 * 0x2e4b2e1b;
    uVar13 = uVar9 * 0x85f1aa5c01fb6d9 + uVar3;
    puVar11 = key + (len - (long)puVar5);
    uVar6 = (uVar13 >> 10 | uVar13 << 0x36) * 0xee783e2f ^ uVar6;
  }
  if (7 < (long)puVar11) {
    lVar8 = *(long *)puVar5;
    puVar5 = puVar5 + 2;
    uVar3 = lVar8 * 0x797a90bb + uVar3;
    uVar3 = uVar3 >> 0x22 | uVar3 * 0x40000000;
    uVar13 = uVar3 * 0x15f7b2cad6b7ddb9 + uVar6;
    uVar3 = (uVar13 >> 0x16 | uVar13 << 0x2a) * 0xad07c493 ^ uVar3 * 0x2e4b2e1b;
    puVar11 = key + (len - (long)puVar5);
  }
  if (3 < (long)puVar11) {
    uVar2 = *puVar5;
    puVar5 = puVar5 + 1;
    uVar9 = crc32(uVar3,(ulong)uVar2);
    uVar13 = (uVar9 ^ uVar6) * 0x2e4b2e1b + uVar3;
    uVar6 = (uVar13 >> 0xe | uVar13 << 0x32) * 0xee783e2f ^ uVar9 ^ uVar6;
    puVar11 = key + (len - (long)puVar5);
  }
  if (1 < (long)puVar11) {
    uVar2 = *puVar5;
    puVar5 = (uint *)((long)puVar5 + 2);
    puVar11 = key + (len - (long)puVar5);
    uVar9 = crc32(uVar6,(ulong)(ushort)uVar2);
    uVar13 = (uVar9 ^ uVar3) * 0x797a90bb + uVar6;
    uVar3 = (uVar13 >> 0xf | uVar13 << 0x31) * 0xad07c493 ^ uVar9 ^ uVar3;
  }
  if (0 < (long)puVar11) {
    uVar9 = crc32(uVar3,(ulong)(byte)*puVar5);
    uVar13 = (uVar9 ^ uVar6) * 0x2e4b2e1b + uVar3;
    uVar6 = (uVar13 >> 0x12 | uVar13 << 0x2e) * 0xee783e2f ^ uVar9 ^ uVar6;
  }
  uVar13 = uVar3 * 0xee783e2f + uVar6;
  lVar12 = (uVar13 >> 0xf | uVar13 << 0x31) + uVar3;
  uVar3 = uVar6 * 0xad07c493 + lVar12;
  lVar8 = (uVar3 >> 0x1b | uVar3 << 0x25) + uVar6;
  uVar3 = lVar12 * 0xee783e2f + lVar8;
  lVar12 = (uVar3 >> 0xf | uVar3 << 0x31) + lVar12;
  uVar3 = lVar8 * 0xad07c493 + lVar12;
  *(long *)out = lVar12;
  *(ulong *)(out + 8) = (uVar3 >> 0x1b | uVar3 << 0x25) + lVar8;
  return;
}

Assistant:

void metrohash128crc_2(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xEE783E2F;
    static const uint64_t k1 = 0xAD07C493;
    static const uint64_t k2 = 0x797A90BB;
    static const uint64_t k3 = 0x2E4B2E1B;

    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(key);
    const uint8_t * const end = ptr + len;
    
    uint64_t v[4];
    
    v[0] = ((static_cast<uint64_t>(seed) - k0) * k3) + len;
    v[1] = ((static_cast<uint64_t>(seed) + k1) * k2) + len;
    
    if (len >= 32)
    {        
        v[2] = ((static_cast<uint64_t>(seed) + k0) * k2) + len;
        v[3] = ((static_cast<uint64_t>(seed) - k1) * k3) + len;

        do
        {
            v[0] ^= _mm_crc32_u64(v[0], read_u64(ptr)); ptr += 8;
            v[1] ^= _mm_crc32_u64(v[1], read_u64(ptr)); ptr += 8;
            v[2] ^= _mm_crc32_u64(v[2], read_u64(ptr)); ptr += 8;
            v[3] ^= _mm_crc32_u64(v[3], read_u64(ptr)); ptr += 8;
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 12) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 19) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 12) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 19) * k0;
    }
    
    if ((end - ptr) >= 16)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],41) * k3;
        v[1] += read_u64(ptr) * k2; ptr += 8; v[1] = rotate_right(v[1],41) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 10) * k1;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 10) * k0;
    }
    
    if ((end - ptr) >= 8)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],34) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 22) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u32(ptr)); ptr += 4;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 14) * k0;
    }
    
    if ((end - ptr) >= 2)
    {
        v[0] ^= _mm_crc32_u64(v[1], read_u16(ptr)); ptr += 2;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 15) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u8 (ptr));
        v[1] ^= rotate_right((v[1] * k3) + v[0],  18) * k0;
    }
    
    v[0] += rotate_right((v[0] * k0) + v[1], 15);
    v[1] += rotate_right((v[1] * k1) + v[0], 27);
    v[0] += rotate_right((v[0] * k0) + v[1], 15);
    v[1] += rotate_right((v[1] * k1) + v[0], 27);

    memcpy(out, v, 16);
}